

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O2

bool operator<(CardStyle *a,CardStyle *b)

{
  Type TVar1;
  Type TVar2;
  bool bVar3;
  
  TVar1 = a->type;
  TVar2 = b->type;
  bVar3 = true;
  if (TVar2 == PASS || TVar1 != PASS) {
    if (((TVar1 == TVar2) && (a->len == b->len)) && (a->carry == b->carry)) {
      return a->id < b->id;
    }
    if (TVar2 != JOKER_BOMB) {
      bVar3 = TVar2 == QUARD_BOMB && TVar1 != JOKER_BOMB;
    }
  }
  return bVar3;
}

Assistant:

inline bool operator<(const CardStyle &a, const CardStyle &b) {
    if (a.type == CardStyle::PASS && b.type != CardStyle::PASS)  return true;
    if (a.type == b.type && a.len == b.len && a.carry == b.carry) {
        return a.id < b.id;
    }
    if (b.type == CardStyle::JOKER_BOMB) {
        return true;
    }
    if (a.type != CardStyle::JOKER_BOMB &&
            b.type == CardStyle::QUARD_BOMB) {
        return true;
    }
    return false;
}